

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  ushort uVar1;
  short sVar2;
  ValueHolder *in_RSI;
  ValueHolder *in_RDI;
  int temp2;
  ValueType temp;
  
  uVar1 = *(ushort *)(in_RDI + 1);
  *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0xff00 | *(ushort *)(in_RSI + 1) & 0xff;
  *(ushort *)(in_RSI + 1) = *(ushort *)(in_RSI + 1) & 0xff00 | uVar1 & 0xff;
  std::swap<Json::Value::ValueHolder>(in_RDI,in_RSI);
  sVar2 = *(short *)(in_RDI + 1);
  *(ushort *)(in_RDI + 1) =
       *(ushort *)(in_RDI + 1) & 0xfeff | ((short)(*(short *)(in_RSI + 1) << 7) >> 0xf & 1U) << 8;
  *(ushort *)(in_RSI + 1) =
       *(ushort *)(in_RSI + 1) & 0xfeff | ((short)(sVar2 << 7) >> 0xf & 1U) << 8;
  std::swap<unsigned_long>(&in_RDI[3].uint_,&in_RSI[3].uint_);
  std::swap<unsigned_long>(&in_RDI[4].uint_,&in_RSI[4].uint_);
  return;
}

Assistant:

void Value::swap(Value& other) {
  ValueType temp = type_;
  type_ = other.type_;
  other.type_ = temp;
  std::swap(value_, other.value_);
  int temp2 = allocated_;
  allocated_ = other.allocated_;
  other.allocated_ = temp2;
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}